

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QMdiAreaPrivate::activateWindow(QMdiAreaPrivate *this,QMdiSubWindow *child)

{
  Data *pDVar1;
  bool bVar2;
  QObject *pQVar3;
  QMdiSubWindowPrivate *this_00;
  
  if ((this->childWindows).d.size != 0) {
    if (child == (QMdiSubWindow *)0x0) {
      bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this->active);
      if (bVar2) {
        QMdiSubWindowPrivate::setActive
                  (*(QMdiSubWindowPrivate **)((this->active).wp.value + 8),false,true);
        resetActiveWindow(this,(QMdiSubWindow *)0x0);
        return;
      }
    }
    else if ((((child->super_QWidget).data)->widget_attributes & 0x10000) == 0) {
      pDVar1 = (this->active).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar3 = (QObject *)0x0;
      }
      else {
        pQVar3 = (this->active).wp.value;
      }
      if (pQVar3 != (QObject *)child) {
        this_00 = *(QMdiSubWindowPrivate **)&(child->super_QWidget).field_0x8;
        if (this_00->isActive == true) {
          bVar2 = QWeakPointer<QObject>::isNull(&(this->active).wp);
          this_00 = *(QMdiSubWindowPrivate **)&(child->super_QWidget).field_0x8;
          if (bVar2) {
            this_00->isActive = false;
          }
        }
        QMdiSubWindowPrivate::setActive(this_00,true,true);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }